

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O1

error __thiscall ald::imm_attr(ald *this,context *ctx,token *token,opcode *op)

{
  int iVar1;
  error *tmpres___LINE__;
  uint64_t value;
  long local_58;
  token local_50;
  
  iVar1 = equal(token,"a");
  if (iVar1 == 0) {
    fail((token *)this,(char *)token,"expected \'a\'");
  }
  else {
    context::tokenize(&local_50,ctx);
    token->column = local_50.column;
    (token->data).string._M_str = local_50.data.string._M_str;
    token->type = local_50.type;
    token->line = local_50.line;
    token->filename = local_50.filename;
    (token->data).predicate = local_50.data.predicate;
    confirm_type((token *)this,(token_type)token);
    if (*(long *)this != 0) {
      return (unique_ptr<char[],_std::default_delete<char[]>_>)
             (unique_ptr<char[],_std::default_delete<char[]>_>)this;
    }
    *(undefined8 *)this = 0;
    context::tokenize(&local_50,ctx);
    token->column = local_50.column;
    (token->data).string._M_str = local_50.data.string._M_str;
    token->type = local_50.type;
    token->line = local_50.line;
    token->filename = local_50.filename;
    (token->data).predicate = local_50.data.predicate;
    convert_integer((token *)this,(int64_t)token,0,(uint64_t *)0x3ff);
    if (*(long *)this == 0) {
      *(undefined8 *)this = 0;
      if ((op->value & local_58 << 0x14) != 0) goto LAB_0011f532;
      op->value = op->value | local_58 << 0x14;
      context::tokenize(&local_50,ctx);
      token->column = local_50.column;
      (token->data).string._M_str = local_50.data.string._M_str;
      token->type = local_50.type;
      token->line = local_50.line;
      token->filename = local_50.filename;
      (token->data).predicate = local_50.data.predicate;
      *(undefined8 *)this = 0;
    }
    if (*(long *)this == 0) {
      *(undefined8 *)this = 0;
      if ((op->value & 0xff00) != 0) {
LAB_0011f532:
        __assert_fail("(value & bits) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/opcode.h"
                      ,0x31,"void opcode::add_bits(uint64_t)");
      }
      op->value = op->value | 0xff00;
      confirm_type((token *)this,(token_type)token);
      if (*(long *)this == 0) {
        *(undefined8 *)this = 0;
        context::tokenize(&local_50,ctx);
        token->column = local_50.column;
        (token->data).string._M_str = local_50.data.string._M_str;
        token->type = local_50.type;
        token->line = local_50.line;
        token->filename = local_50.filename;
        (token->data).predicate = local_50.data.predicate;
        *(undefined8 *)this = 0;
      }
    }
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(imm_attr)
    {
        if (!equal(token, "a")) {
            return fail(token, "expected 'a'");
        }
        token = ctx.tokenize();

        CHECK(confirm_type(token, token_type::bracket_left));
        token = ctx.tokenize();

        CHECK((uinteger<10, 20>(ctx, token, op)));
        op.add_bits(0xFFULL << 8);

        CHECK(confirm_type(token, token_type::bracket_right));
        token = ctx.tokenize();
        return {};
    }